

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  optional<int> *value;
  string local_40;
  bool local_19;
  expression_lhs *local_18;
  expression_lhs<const_std::optional<int>_&> *this_local;
  
  local_18 = this;
  this_local = (expression_lhs<const_std::optional<int>_&> *)__return_storage_ptr__;
  local_19 = std::optional::operator_cast_to_bool(*(optional **)this);
  to_string<std::optional<int>>(&local_40,*(lest **)this,value);
  result::result<bool>(__return_storage_ptr__,&local_19,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }